

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void in_memory_snapshot_compaction_test(void)

{
  fdb_status fVar1;
  int iVar2;
  cb_inmem_snap_args cargs;
  fdb_status s;
  fdb_doc *doc;
  fdb_iterator *fit;
  fdb_kvs_info info;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_kvs_handle *snap;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db;
  fdb_file_handle *db_file;
  size_t valuelen;
  void *value_out;
  char valuestr [10];
  char keystr [6];
  char *value;
  char key [256];
  char cmd [256];
  int idx;
  int c;
  int r;
  int i;
  int value_len;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 in_stack_fffffffffffffa98;
  undefined2 uVar3;
  undefined2 in_stack_fffffffffffffa9a;
  undefined2 uVar4;
  undefined4 in_stack_fffffffffffffa9c;
  fdb_file_handle *in_stack_fffffffffffffaa0;
  fdb_iterator *in_stack_fffffffffffffaa8;
  size_t *psVar5;
  size_t *in_stack_fffffffffffffab8;
  fdb_kvs_config *in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffac8;
  fdb_kvs_handle **in_stack_fffffffffffffad0;
  fdb_kvs_handle *in_stack_fffffffffffffad8;
  fdb_doc **in_stack_fffffffffffffb10;
  fdb_iterator *in_stack_fffffffffffffb18;
  char local_430 [8];
  int local_428;
  undefined4 local_424;
  int local_420;
  undefined4 *local_418;
  char *local_410;
  fdb_status local_404;
  fdb_kvs_info *in_stack_fffffffffffffc00;
  size_t *psVar6;
  fdb_kvs_handle *in_stack_fffffffffffffc08;
  long local_3e8;
  fdb_kvs_config *kvs_config_00;
  char *kvs_name;
  fdb_kvs_handle **ptr_handle;
  fdb_file_handle *in_stack_fffffffffffffc58;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffcbc;
  char *filename;
  fdb_file_handle **in_stack_fffffffffffffcc8;
  fdb_seqnum_t in_stack_fffffffffffffd40;
  fdb_kvs_handle **in_stack_fffffffffffffd48;
  fdb_kvs_handle *in_stack_fffffffffffffd50;
  size_t local_290;
  void *local_288;
  char local_280 [10];
  undefined4 local_276;
  undefined2 local_272;
  char *local_270;
  size_t local_268 [32];
  char local_168 [256];
  uint local_68;
  uint local_64;
  int local_60;
  uint local_5c;
  int local_58;
  int local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_54 = 10;
  local_58 = 0x20;
  local_276 = 0x3530256b;
  local_272 = 100;
  builtin_strncpy(local_280,"value%08d",10);
  sprintf(local_168,"rm -rf  mvcc_test* > errorlog.txt");
  local_60 = system(local_168);
  memleak_start();
  local_270 = (char *)malloc((long)local_58);
  fdb_get_default_config();
  memcpy(&stack0xfffffffffffffc58,&stack0xfffffffffffffad8,0xf8);
  uVar7 = 2;
  filename = local_430;
  fdb_get_default_kvs_config();
  kvs_config_00 = in_stack_fffffffffffffac0;
  kvs_name = in_stack_fffffffffffffac8;
  ptr_handle = in_stack_fffffffffffffad0;
  local_404 = fdb_open(in_stack_fffffffffffffcc8,filename,
                       (fdb_config *)CONCAT44(in_stack_fffffffffffffcbc,uVar7));
  if (local_404 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x662);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_404 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x662,"void in_memory_snapshot_compaction_test()");
    }
  }
  local_404 = fdb_kvs_open(in_stack_fffffffffffffc58,ptr_handle,kvs_name,kvs_config_00);
  if (local_404 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x664);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_404 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x664,"void in_memory_snapshot_compaction_test()");
    }
  }
  local_404 = fdb_kvs_open(in_stack_fffffffffffffc58,ptr_handle,kvs_name,kvs_config_00);
  if (local_404 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x667);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_404 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x667,"void in_memory_snapshot_compaction_test()");
    }
  }
  local_424 = 0;
  local_428 = local_54;
  local_418 = &local_276;
  local_410 = local_280;
  local_420 = local_58;
  for (local_5c = 0; (int)local_5c < local_54; local_5c = local_5c + 1) {
    local_68 = local_5c;
    sprintf((char *)local_268,(char *)&local_276,(ulong)local_5c);
    memset(local_270,0x78,(long)local_58);
    builtin_strncpy(local_270 + (long)local_58 + -6,"<end>",6);
    sprintf(local_270,local_280,(ulong)local_68);
    in_stack_fffffffffffffab8 = local_268;
    strlen((char *)local_268);
    local_404 = fdb_set_kv(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                           (size_t)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                           (size_t)in_stack_fffffffffffffab8);
    if (local_404 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x678);
      in_memory_snapshot_compaction_test::__test_pass = 0;
      if (local_404 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x678,"void in_memory_snapshot_compaction_test()");
      }
    }
  }
  local_404 = fdb_commit((fdb_file_handle *)
                         CONCAT44(in_stack_fffffffffffffa9c,
                                  CONCAT22(in_stack_fffffffffffffa9a,in_stack_fffffffffffffa98)),
                         '\0');
  if (local_404 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x67b);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_404 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x67b,"void in_memory_snapshot_compaction_test()");
    }
  }
  local_404 = fdb_compact(in_stack_fffffffffffffaa0,
                          (char *)CONCAT44(in_stack_fffffffffffffa9c,
                                           CONCAT22(in_stack_fffffffffffffa9a,
                                                    in_stack_fffffffffffffa98)));
  if (local_404 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x67e);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_404 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x67e,"void in_memory_snapshot_compaction_test()");
    }
  }
  local_404 = fdb_snapshot_open(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                                in_stack_fffffffffffffd40);
  if (local_404 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x682);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_404 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x682,"void in_memory_snapshot_compaction_test()");
    }
  }
  local_404 = fdb_get_kvs_info(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  if (local_404 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x685);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_404 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x685,"void in_memory_snapshot_compaction_test()");
    }
  }
  if (local_3e8 != (long)local_54 + 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x686);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_3e8 != (long)local_54 + 1) {
      __assert_fail("info.last_seqnum == (fdb_seqnum_t)n+1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x686,"void in_memory_snapshot_compaction_test()");
    }
  }
  uVar3 = 0;
  uVar4 = 0;
  local_404 = fdb_iterator_init(in_stack_fffffffffffffd50,(fdb_iterator **)&stack0xfffffffffffffc08,
                                (void *)0x0,0,(void *)0x0,0,0);
  if (local_404 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x689);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_404 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x689,"void in_memory_snapshot_compaction_test()");
    }
  }
  local_64 = 0;
  do {
    psVar6 = (size_t *)0x0;
    local_404 = fdb_iterator_get(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
    if (local_404 != FDB_RESULT_SUCCESS) break;
    if ((int)local_64 < local_54) {
      local_68 = local_64;
      sprintf((char *)local_268,(char *)&local_276,(ulong)local_64);
      memset(local_270,0x78,(long)local_58);
      builtin_strncpy(local_270 + (long)local_58 + -6,"<end>",6);
      sprintf(local_270,local_280,(ulong)local_68);
      iVar2 = memcmp((void *)psVar6[4],local_268,*psVar6);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_268,psVar6[4],
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x698);
        in_memory_snapshot_compaction_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x698,"void in_memory_snapshot_compaction_test()");
      }
      iVar2 = memcmp((void *)psVar6[8],local_270,psVar6[2]);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_270,psVar6[8],
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x699);
        in_memory_snapshot_compaction_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x699,"void in_memory_snapshot_compaction_test()");
      }
    }
    else {
      sprintf((char *)local_268,"new_key");
      sprintf(local_270,"new_value");
      iVar2 = memcmp((void *)psVar6[4],local_268,*psVar6);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_268,psVar6[4],
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x69e);
        in_memory_snapshot_compaction_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x69e,"void in_memory_snapshot_compaction_test()");
      }
      iVar2 = memcmp((void *)psVar6[8],local_270,psVar6[2]);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_270,psVar6[8],
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x69f);
        in_memory_snapshot_compaction_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x69f,"void in_memory_snapshot_compaction_test()");
      }
    }
    local_64 = local_64 + 1;
    fdb_doc_free((fdb_doc *)0x10da87);
    fVar1 = fdb_iterator_next((fdb_iterator *)
                              CONCAT44(in_stack_fffffffffffffa9c,CONCAT22(uVar4,uVar3)));
  } while (fVar1 == FDB_RESULT_SUCCESS);
  if (local_64 != local_54 + 1U) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x6a5);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_64 != local_54 + 1U) {
      __assert_fail("c == n + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x6a5,"void in_memory_snapshot_compaction_test()");
    }
  }
  local_404 = fdb_iterator_close(in_stack_fffffffffffffaa8);
  if (local_404 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x6a8);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_404 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x6a8,"void in_memory_snapshot_compaction_test()");
    }
  }
  psVar5 = local_268;
  strlen((char *)local_268);
  local_404 = fdb_get_kv(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                         (size_t)in_stack_fffffffffffffac8,(void **)in_stack_fffffffffffffac0,
                         in_stack_fffffffffffffab8);
  if (local_404 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x6ab);
    in_memory_snapshot_compaction_test::__test_pass = 0;
    if (local_404 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x6ab,"void in_memory_snapshot_compaction_test()");
    }
  }
  iVar2 = memcmp(local_288,local_270,local_290);
  if (iVar2 == 0) {
    fdb_free_block((void *)0x10dcd7);
    fdb_kvs_close((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffa9c,CONCAT22(uVar4,uVar3)));
    local_404 = fdb_close((fdb_file_handle *)
                          CONCAT44(in_stack_fffffffffffffa9c,CONCAT22(uVar4,uVar3)));
    if (local_404 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x6b2);
      in_memory_snapshot_compaction_test::__test_pass = 0;
      if (local_404 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x6b2,"void in_memory_snapshot_compaction_test()");
      }
    }
    local_404 = fdb_shutdown();
    if (local_404 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x6b4);
      in_memory_snapshot_compaction_test::__test_pass = 0;
      if (local_404 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x6b4,"void in_memory_snapshot_compaction_test()");
      }
    }
    free(local_270);
    memleak_end();
    if (in_memory_snapshot_compaction_test::__test_pass == 0) {
      fprintf(_stderr,"%s FAILED\n","in-memory snapshot with concurrent compaction test");
    }
    else {
      fprintf(_stderr,"%s PASSED\n","in-memory snapshot with concurrent compaction test");
    }
    return;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_270,local_288,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x6ac,uVar3,in_stack_fffffffffffffd50,psVar5);
  in_memory_snapshot_compaction_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x6ac,"void in_memory_snapshot_compaction_test()");
}

Assistant:

void in_memory_snapshot_compaction_test()
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, c, idx;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "k%05d";
    char valuestr[] = "value%08d";
    void *value_out;
    size_t valuelen;
    fdb_file_handle *db_file;
    fdb_kvs_handle *db, *db2, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_status s;
    struct cb_inmem_snap_args cargs;

    sprintf(cmd, SHELL_DEL " mvcc_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    config = fdb_get_default_config();
    config.durability_opt = FDB_DRB_ASYNC;
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.wal_threshold = n/5;
    config.multi_kv_instances = true;
    config.buffercache_size = 0;
    config.compaction_cb = cb_inmem_snap;
    config.compaction_cb_mask = FDB_CS_MOVE_DOC;
    config.compaction_cb_ctx = &cargs;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./mvcc_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(db_file, &db2, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    cargs.handle = db2;
    cargs.move_count = 0;
    cargs.n = n;
    cargs.keystr = keystr;
    cargs.valuestr = valuestr;
    cargs.value_len = value_len;

    // write
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_commit(db_file, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_compact(db_file, "./mvcc_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open in-memory snapshot
    s = fdb_snapshot_open(db, &snap, FDB_SNAPSHOT_INMEM);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(snap, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(info.last_seqnum == (fdb_seqnum_t)n+1);

    s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    c = 0;
    do {
        doc = NULL;
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        if (c < n) {
            idx = c;
            sprintf(key, keystr, idx);
            memset(value, 'x', value_len);
            memcpy(value + value_len - 6, "<end>", 6);
            sprintf(value, valuestr, idx);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
        } else {
            // new document
            sprintf(key, "new_key");
            sprintf(value, "new_value");
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
        }

        c++;
        fdb_doc_free(doc);
    } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    TEST_CHK(c == n + 1);

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kv(snap, (void*)key, strlen(key)+1, &value_out, &valuelen);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CMP(value_out, value, valuelen);
    fdb_free_block(value_out);

    fdb_kvs_close(snap);

    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);

    memleak_end();

    TEST_RESULT("in-memory snapshot with concurrent compaction test");
}